

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctor.hpp
# Opt level: O2

void __thiscall
njoy::ENDFtk::section::Type<8,_457>::DecaySpectrum::DecaySpectrum
          (DecaySpectrum *this,double type,array<double,_2UL> dnorm,array<double,_2UL> cnorm,
          array<double,_2UL> energy,
          vector<njoy::ENDFtk::section::Type<8,_457>::DiscreteSpectrum,_std::allocator<njoy::ENDFtk::section::Type<8,_457>::DiscreteSpectrum>_>
          *dspectra,ContinuousSpectrum *cspectrum)

{
  pointer pDVar1;
  pointer pDVar2;
  initializer_list<double> __l;
  allocator_type local_159;
  _Vector_base<double,_std::allocator<double>_> local_158;
  double local_140;
  ListRecord local_138;
  double local_f0;
  double local_e8;
  double local_e0;
  double local_d8;
  double local_d0;
  double local_c8;
  _Optional_payload_base<njoy::ENDFtk::section::Type<8,_457>::ContinuousSpectrum> local_c0;
  
  local_d8 = energy._M_elems[1];
  local_e0 = energy._M_elems[0];
  local_c8 = cnorm._M_elems[1];
  local_d0 = cnorm._M_elems[0];
  local_e8 = dnorm._M_elems[1];
  local_f0 = dnorm._M_elems[0];
  pDVar1 = (dspectra->
           super__Vector_base<njoy::ENDFtk::section::Type<8,_457>::DiscreteSpectrum,_std::allocator<njoy::ENDFtk::section::Type<8,_457>::DiscreteSpectrum>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pDVar2 = (dspectra->
           super__Vector_base<njoy::ENDFtk::section::Type<8,_457>::DiscreteSpectrum,_std::allocator<njoy::ENDFtk::section::Type<8,_457>::DiscreteSpectrum>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  __l._M_len = 6;
  __l._M_array = &local_f0;
  local_140 = type;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&local_158,__l,&local_159);
  local_138.metadata.fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Tuple_impl<5UL,_long>.super__Head_base<5UL,_long,_false>
  ._M_head_impl = (_Head_base<5UL,_long,_false>)(((long)pDVar2 - (long)pDVar1) / 0x48);
  local_138.metadata.fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl =
       (long)local_158._M_impl.super__Vector_impl_data._M_finish -
       (long)local_158._M_impl.super__Vector_impl_data._M_start >> 3;
  local_138.metadata.fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Head_base<3UL,_long,_false>._M_head_impl = 0;
  local_138.metadata.fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Head_base<2UL,_long,_false>._M_head_impl = 2
  ;
  local_138.metadata.fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.super__Head_base<1UL,_double,_false>.
  _M_head_impl = local_140;
  local_138.metadata.fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Head_base<0UL,_double,_false>._M_head_impl = 0.0;
  local_138.data.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
  ._M_start = local_158._M_impl.super__Vector_impl_data._M_start;
  local_138.data.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
  ._M_finish = local_158._M_impl.super__Vector_impl_data._M_finish;
  local_138.data.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = local_158._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_158._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_158._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_158._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::optional<njoy::ENDFtk::section::Type<8,_457>::ContinuousSpectrum>::
  optional<njoy::ENDFtk::section::Type<8,_457>::ContinuousSpectrum,_true>
            ((optional<njoy::ENDFtk::section::Type<8,_457>::ContinuousSpectrum> *)&local_c0,
             cspectrum);
  DecaySpectrum(this,&local_138,dspectra,
                (optional<njoy::ENDFtk::section::Type<8,_457>::ContinuousSpectrum> *)&local_c0);
  std::_Optional_payload_base<njoy::ENDFtk::section::Type<8,_457>::ContinuousSpectrum>::_M_reset
            (&local_c0);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&local_138.data.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_158);
  return;
}

Assistant:

DecaySpectrum( double type,
               std::array< double, 2 > dnorm,
               std::array< double, 2 > cnorm,
               std::array< double, 2 > energy,
               std::vector< DiscreteSpectrum >&& dspectra,
               ContinuousSpectrum&& cspectrum )
  try : DecaySpectrum( ListRecord( 0.0, type, 2, 0, dspectra.size(),
                                   { dnorm[0], dnorm[1],
                                     energy[0], energy[1],
                                     cnorm[0], cnorm[1] } ),
                       std::move( dspectra ),
                       std::make_optional( std::move( cspectrum ) ) ) {}
  catch ( std::exception& e ) {

    Log::info( "Encountered error while constructing decay spectrum data "
               "with LCON=2" );
    throw;
  }